

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.h
# Opt level: O2

void __thiscall
pbrt::BufferCache<pbrt::Point3<float>_>::Clear(BufferCache<pbrt::Point3<float>_> *this)

{
  __node_base *p_Var1;
  
  std::mutex::lock(&this->mutex);
  p_Var1 = &(this->cache)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    pstd::pmr::polymorphic_allocator<std::byte>::deallocate_object<pbrt::Point3<float>>
              (&this->alloc,(Point3<float> *)p_Var1[1]._M_nxt,
               (size_t)*(_Hash_node_base **)
                        &((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor);
  }
  std::
  _Hashtable<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_std::allocator<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>,_std::__detail::_Identity,_std::equal_to<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>,_pbrt::BufferCache<pbrt::Point3<float>_>::BufferHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&(this->cache)._M_h);
  this->bytesUsed = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void Clear() {
        std::lock_guard<std::mutex> lock(mutex);
        for (auto iter : cache)
            alloc.deallocate_object(const_cast<T *>(iter.ptr), iter.size);
        cache.clear();
        bytesUsed = 0;
    }